

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O3

Range<int,_3> * __thiscall
Nova::Grid<float,_3>::Node_Indices(Grid<float,_3> *this,int number_of_ghost_cells)

{
  int *piVar1;
  long lVar2;
  Range<int,_3> *in_RDI;
  Vector<int,_3,_true> data_copy;
  undefined8 local_c;
  int local_4;
  
  local_c = 0x100000001;
  local_4 = 1;
  data_copy._data._M_elems._0_8_ = *(undefined8 *)(this->counts)._data._M_elems;
  data_copy._data._M_elems[2] = (this->counts)._data._M_elems[2];
  lVar2 = 0;
  do {
    piVar1 = (int *)((long)data_copy._data._M_elems + lVar2);
    *piVar1 = *piVar1 + 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  do {
    *(int *)((long)&local_c + lVar2) = *(int *)((long)&local_c + lVar2) - number_of_ghost_cells;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  do {
    piVar1 = (int *)((long)data_copy._data._M_elems + lVar2);
    *piVar1 = *piVar1 + number_of_ghost_cells;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  (in_RDI->min_corner)._data._M_elems[2] = local_4;
  *(undefined8 *)(in_RDI->min_corner)._data._M_elems = local_c;
  *(undefined8 *)(in_RDI->max_corner)._data._M_elems = data_copy._data._M_elems._0_8_;
  (in_RDI->max_corner)._data._M_elems[2] = data_copy._data._M_elems[2];
  return in_RDI;
}

Assistant:

Range<int,d> Node_Indices(const int number_of_ghost_cells=0) const
    {return Range<int,d>(T_INDEX(1),Number_Of_Nodes()).Thickened(number_of_ghost_cells);}